

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

void removeStringImpl<QStringView>(QString *s,QStringView *needle,CaseSensitivity cs)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype size;
  char16_t *pcVar4;
  qsizetype qVar5;
  iterator pQVar6;
  iterator __result;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t extraout_RDX_01;
  __off_t __length;
  size_t __n;
  char16_t *__src;
  char16_t *pcVar7;
  char16_t *pcVar8;
  long in_FS_OFFSET;
  QStringView s_00;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = needle->m_size;
  if ((lVar1 != 0) &&
     (s_00.m_data = needle->m_data, s_00.m_size = lVar1, qVar5 = QString::indexOf(s,s_00,0,cs),
     -1 < qVar5)) {
    pDVar2 = (s->d).d;
    pcVar3 = (s->d).ptr;
    size = (s->d).size;
    pcVar4 = pcVar3 + size;
    if ((pDVar2 != (Data *)0x0) &&
       ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
      pcVar8 = pcVar3 + qVar5;
      __length = extraout_RDX;
      pcVar7 = pcVar8;
      while (__src = pcVar7 + lVar1, __src < pcVar4) {
        qVar5 = QString::indexOf(s,*needle,(long)__src - (long)pcVar3 >> 1,cs);
        pcVar7 = pcVar3 + qVar5;
        if (qVar5 == -1) {
          pcVar7 = pcVar4;
        }
        __n = (long)pcVar7 - (long)__src;
        __length = extraout_RDX_00;
        if (__n != 0) {
          memmove(pcVar8,__src,__n);
          __length = extraout_RDX_01;
        }
        pcVar8 = (char16_t *)((long)pcVar8 + __n);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QString::truncate(s,(char *)((long)pcVar8 - (long)pcVar3 >> 1),__length);
        return;
      }
      goto LAB_002efea0;
    }
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)&local_58,size,Uninitialized);
    pQVar6 = QString::begin((QString *)&local_58);
    __result = pQVar6;
    pcVar8 = pcVar3 + qVar5;
    pcVar7 = pcVar3;
    while( true ) {
      __result = std::__copy_move<false,false,std::random_access_iterator_tag>::
                 __copy_m<char16_t*,QChar*>(pcVar7,pcVar8,__result);
      pcVar7 = pcVar8 + lVar1;
      if (pcVar4 <= pcVar7) break;
      qVar5 = QString::indexOf(s,*needle,(long)pcVar7 - (long)pcVar3 >> 1,cs);
      pcVar8 = pcVar3 + qVar5;
      if (qVar5 == -1) {
        pcVar8 = pcVar4;
      }
    }
    QString::resize((QString *)&local_58,(long)__result - (long)pQVar6 >> 1);
    pDVar2 = (s->d).d;
    pcVar4 = (s->d).ptr;
    (s->d).d = local_58.d;
    (s->d).ptr = local_58.ptr;
    qVar5 = (s->d).size;
    (s->d).size = local_58.size;
    local_58.d = pDVar2;
    local_58.ptr = pcVar4;
    local_58.size = qVar5;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_002efea0:
  __stack_chk_fail();
}

Assistant:

static void removeStringImpl(QString &s, const T &needle, Qt::CaseSensitivity cs)
{
    const auto needleSize = needle.size();
    if (!needleSize)
        return;

    // avoid detach if nothing to do:
    qsizetype i = s.indexOf(needle, 0, cs);
    if (i < 0)
        return;

    QString::DataPointer &dptr = s.data_ptr();
    auto begin = dptr.begin();
    auto end = dptr.end();

    auto copyFunc = [&](auto &dst) {
        auto src = begin + i + needleSize;
        while (src < end) {
            i = s.indexOf(needle, std::distance(begin, src), cs);
            auto hit = i == -1 ? end : begin + i;
            dst = std::copy(src, hit, dst);
            src = hit + needleSize;
        }
        return dst;
    };

    if (!dptr->needsDetach()) {
        auto dst = begin + i;
        dst = copyFunc(dst);
        s.truncate(std::distance(begin, dst));
    } else {
        QString copy{s.size(), Qt::Uninitialized};
        auto copy_begin = copy.begin();
        auto dst = std::copy(begin, begin + i, copy_begin); // Chunk before the first hit
        dst = copyFunc(dst);
        copy.resize(std::distance(copy_begin, dst));
        s.swap(copy);
    }
}